

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

matrix sptk::swipe::nansm(int xSz,int ySz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  matrix mVar5;
  
  mVar5 = makem(xSz,ySz);
  uVar2 = 0;
  uVar1 = mVar5._0_8_ >> 0x20;
  if (mVar5.y == 0 || (long)mVar5._0_8_ < 0) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if (0 < mVar5.x) {
    uVar3 = (ulong)(uint)mVar5.x;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      mVar5.m[uVar2][uVar4] = NAN;
    }
  }
  return mVar5;
}

Assistant:

matrix nansm(int xSz, int ySz) {
    matrix nw_matrix = makem(xSz, ySz);
    int i, j;
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = NAN;
    return(nw_matrix);
}